

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int bio_flush(opj_bio_t *bio)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = bio->buf;
  uVar3 = uVar1 & 0xff;
  bio->buf = uVar3 << 8;
  bio->ct = (uVar3 != 0xff) + 7;
  puVar2 = bio->bp;
  iVar4 = 1;
  if (puVar2 < bio->end) {
    bio->bp = puVar2 + 1;
    *puVar2 = (uchar)uVar1;
    if (bio->ct == 7) {
      uVar1 = bio->buf;
      uVar3 = uVar1 & 0xff;
      bio->buf = uVar3 << 8;
      bio->ct = (uVar3 != 0xff) + 7;
      puVar2 = bio->bp;
      if (bio->end <= puVar2) {
        return 1;
      }
      bio->bp = puVar2 + 1;
      *puVar2 = (uchar)uVar1;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int bio_byteout(opj_bio_t *bio) {
	bio->buf = (bio->buf << 8) & 0xffff;
	bio->ct = bio->buf == 0xff00 ? 7 : 8;
	if (bio->bp >= bio->end) {
		return 1;
	}
	*bio->bp++ = bio->buf >> 8;
	return 0;
}